

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  Solver *this;
  allocator local_39;
  string local_38;
  Solver *solver;
  
  solver._4_4_ = 0;
  this = (Solver *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"data/area_names/area_names_small.txt",&local_39)
  ;
  Solver::Solver(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return 0;
}

Assistant:

int main()
{
//	Solver *solver = new Solver("data/disease_names/disease_names.txt");
//	Solver *solver = new Solver("data/dept_names/dept_names.txt");
//	Solver *solver = new Solver("data/course_names/course_names.txt");
	Solver *solver = new Solver("data/area_names/area_names_small.txt");

//	Exp::preprocess();
//	Exp::varyDictionary();
//	Exp::varyThreshold();
//	Exp::varyMeasure();
//	Exp::calculateMeasurePRF();
//	Exp::calculateDictPRF();
//	Exp::check();
//	Exp::check2();
//	Exp::genDirty();
//	Exp::dictionary_scale();
//	Exp::joinalgo_scale();
//	Exp::show_datasets();
//	Exp::testRuleCompression();
//	Exp::genSubset()
//	Exp::genDBData(1);
	return 0;
}